

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>::RefBuilderLarge
::attachBuildRefs(RefBuilderLarge *this,
                 BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  atomic<int> *paVar1;
  int iVar2;
  BVHN<4> *pBVar3;
  Geometry *pGVar4;
  BuildRef *pBVar5;
  uint uVar6;
  undefined4 uVar7;
  Geometry *pGVar9;
  undefined1 auVar10 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  undefined1 auVar12 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  ulong uVar8;
  
  uVar8 = this->objectID_;
  pBVar3 = (topBuilder->bvh->objects).
           super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
  pGVar4 = (topBuilder->scene->geometries).items[uVar8].ptr;
  if (pGVar4 != (Geometry *)0x0) {
    if ((topBuilder->scene->geometryModCounters_).items[uVar8] < pGVar4->modCounter_) {
      uVar6 = (*(((this->builder_).ptr)->super_RefCount)._vptr_RefCount[4])();
      uVar8 = (ulong)uVar6;
    }
  }
  auVar10 = minps((undefined1  [16])(pBVar3->super_AccelData).bounds.bounds0.lower.field_0,
                  (undefined1  [16])(pBVar3->super_AccelData).bounds.bounds1.lower.field_0);
  auVar12 = maxps((undefined1  [16])(pBVar3->super_AccelData).bounds.bounds0.upper.field_0,
                  (undefined1  [16])(pBVar3->super_AccelData).bounds.bounds1.upper.field_0);
  auVar14._4_4_ = -(uint)(auVar10._4_4_ <= auVar12._4_4_);
  auVar14._0_4_ = -(uint)(auVar10._0_4_ <= auVar12._0_4_);
  auVar14._8_4_ = -(uint)(auVar10._8_4_ <= auVar12._8_4_);
  auVar14._12_4_ = -(uint)(auVar10._12_4_ <= auVar12._12_4_);
  uVar7 = movmskps((int)uVar8,auVar14);
  if ((~(byte)uVar7 & 7) == 0) {
    pGVar4 = (topBuilder->scene->geometries).items[this->objectID_].ptr;
    pGVar9 = (Geometry *)0x0;
    if (*(char *)&pGVar4->field_8 == '\x14') {
      pGVar9 = pGVar4;
    }
    uVar8 = (pBVar3->root).ptr;
    aVar11._0_12_ = auVar10._0_12_;
    aVar11.m128[3] = (float)(int)this->objectID_;
    aVar13._0_12_ = auVar12._0_12_;
    aVar13.m128[3] = (float)pGVar9->numPrimitives;
    fVar15 = 0.0;
    if ((uVar8 & 8) == 0) {
      fVar15 = auVar12._4_4_ - auVar10._4_4_;
      fVar16 = auVar12._8_4_ - auVar10._8_4_;
      fVar15 = (fVar15 + fVar16) * (auVar12._0_4_ - auVar10._0_4_) + fVar16 * fVar15;
      fVar15 = fVar15 + fVar15;
    }
    LOCK();
    paVar1 = &topBuilder->nextRef;
    iVar2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar5 = (topBuilder->refs).items;
    pBVar5[iVar2].super_PrimRef.lower.field_0 = aVar11;
    pBVar5[iVar2].super_PrimRef.upper.field_0 = aVar13;
    pBVar5[iVar2].node.ptr = uVar8;
    pBVar5[iVar2].bounds_area = fVar15;
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder)
        {
          BVH* object  = topBuilder->getBVH(objectID_); assert(object);
          
          /* build object if it got modified */
          if (topBuilder->isGeometryModified(objectID_))
            builder_->build();

          /* create build primitive */
          if (!object->getBounds().empty())
          {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            Mesh* mesh = topBuilder->getMesh(objectID_);
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root,(unsigned int)objectID_,(unsigned int)mesh->size());
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root);
#endif
          }
        }